

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signal.h
# Opt level: O2

void __thiscall
sc_core::sc_signal_t<sc_dt::sc_logic,_(sc_core::sc_writer_policy)0>::update
          (sc_signal_t<sc_dt::sc_logic,_(sc_core::sc_writer_policy)0> *this)

{
  sc_writer_policy_check_write::update
            (&(this->super_sc_writer_policy_check<(sc_core::sc_writer_policy)0>).
              super_sc_writer_policy_check_write);
  if ((this->m_new_val).m_val == (this->m_cur_val).m_val) {
    return;
  }
  do_update(this);
  return;
}

Assistant:

void
sc_signal_t<T,POL>::update()
{
    policy_type::update();
    if( !( m_new_val == m_cur_val ) ) {
        do_update();
    }
}